

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O2

cmSourceGroup * __thiscall cmSourceGroup::LookupChild(cmSourceGroup *this,char *name)

{
  cmSourceGroup *pcVar1;
  cmSourceGroup *pcVar2;
  bool bVar3;
  cmSourceGroup *pcVar4;
  string sgName;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pcVar4 = pcVar2;
    if (pcVar4 == pcVar1) {
      return (cmSourceGroup *)0x0;
    }
    std::__cxx11::string::string((string *)&local_50,(pcVar4->Name)._M_dataplus._M_p,&local_51);
    bVar3 = std::operator==(&local_50,name);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar2 = pcVar4 + 1;
  } while (!bVar3);
  return pcVar4;
}

Assistant:

cmSourceGroup* cmSourceGroup::LookupChild(const char* name) const
{
  // initializing iterators
  std::vector<cmSourceGroup>::const_iterator iter =
    this->Internal->GroupChildren.begin();
  const std::vector<cmSourceGroup>::const_iterator end =
    this->Internal->GroupChildren.end();

  // st
  for (; iter != end; ++iter) {
    std::string sgName = iter->GetName();

    // look if descenened is the one were looking for
    if (sgName == name) {
      return const_cast<cmSourceGroup*>(&(*iter)); // if it so return it
    }
  }

  // if no child with this name was found return NULL
  return CM_NULLPTR;
}